

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield.hpp
# Opt level: O2

void MeanField::applySoftmaxIndividual(float *QDistribution,float *out,int idx,int dimensions)

{
  int i;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)dimensions;
  if (dimensions < 1) {
    uVar2 = uVar3;
  }
  lVar1 = (long)(idx * dimensions);
  fVar5 = 0.0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    fVar4 = expf(QDistribution[lVar1 + uVar3]);
    out[lVar1 + uVar3] = fVar4;
    fVar5 = fVar5 + fVar4;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    out[lVar1 + uVar3] = out[lVar1 + uVar3] / fVar5;
  }
  return;
}

Assistant:

__SHARED_CODE__
        inline void applySoftmaxIndividual(const float *QDistribution, float *out, int idx, int dimensions) {
        float normaliser = 0.0;
        int localIdx;
        for (int i = 0; i < dimensions; i++) {
            localIdx = idx * dimensions + i;
            out[localIdx] = expf(QDistribution[localIdx]);
            normaliser += out[localIdx];
        }

        for (int i = 0; i < dimensions; i++) {
            out[idx*dimensions + i] /= normaliser;
        }
    }